

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_biased.cc
# Opt level: O2

int64_t __thiscall
absl::lts_20250127::profiling_internal::ExponentialBiased::GetSkipCount
          (ExponentialBiased *this,int64_t mean)

{
  int64_t iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (this->initialized_ == false) {
    Initialize(this);
  }
  uVar2 = this->rng_ * 0x5deece66d + 0xb & 0xffffffffffff;
  this->rng_ = uVar2;
  dVar4 = this->bias_;
  dVar3 = log2((double)((int)(uVar2 >> 0x16) + 1));
  dVar4 = (double)mean * -0.6931471805599453 * (dVar3 + -26.0) + dVar4;
  if (dVar4 <= 4.611686018427388e+18) {
    dVar3 = rint(dVar4);
    this->bias_ = dVar4 - dVar3;
    iVar1 = (int64_t)dVar3;
  }
  else {
    iVar1 = 0x3fffffffffffffff;
  }
  return iVar1;
}

Assistant:

int64_t ExponentialBiased::GetSkipCount(int64_t mean) {
  if (ABSL_PREDICT_FALSE(!initialized_)) {
    Initialize();
  }

  uint64_t rng = NextRandom(rng_);
  rng_ = rng;

  // Take the top 26 bits as the random number
  // (This plus the 1<<58 sampling bound give a max possible step of
  // 5194297183973780480 bytes.)
  // The uint32_t cast is to prevent a (hard-to-reproduce) NAN
  // under piii debug for some binaries.
  double q = static_cast<uint32_t>(rng >> (kPrngNumBits - 26)) + 1.0;
  // Put the computed p-value through the CDF of a geometric.
  double interval = bias_ + (std::log2(q) - 26) * (-std::log(2.0) * mean);
  // Very large values of interval overflow int64_t. To avoid that, we will
  // cheat and clamp any huge values to (int64_t max)/2. This is a potential
  // source of bias, but the mean would need to be such a large value that it's
  // not likely to come up. For example, with a mean of 1e18, the probability of
  // hitting this condition is about 1/1000. For a mean of 1e17, standard
  // calculators claim that this event won't happen.
  if (interval > static_cast<double>(std::numeric_limits<int64_t>::max() / 2)) {
    // Assume huge values are bias neutral, retain bias for next call.
    return std::numeric_limits<int64_t>::max() / 2;
  }
  double value = std::rint(interval);
  bias_ = interval - value;
  return value;
}